

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall cs::statement_expression::~statement_expression(statement_expression *this)

{
  void *in_RSI;
  
  ~statement_expression(this);
  statement_base::operator_delete(&this->super_statement_base,in_RSI);
  return;
}

Assistant:

statement_expression() = delete;